

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall mp::BasicSolver::ParseOptionString(BasicSolver *this,char *s,uint flags)

{
  int iVar1;
  size_t i;
  char *pcVar2;
  long lVar3;
  SolverOption *pSVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char cVar6;
  char *s_local;
  uint local_e0;
  uint local_dc;
  SolverOptionManager *local_d8;
  _func_int **local_d0;
  MemoryBuffer<char,_50UL,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8 = &this->super_SolverOptionManager;
  local_d0 = (_func_int **)&PTR_grow_00265760;
  local_dc = (flags & 2) >> 1;
  s_local = s;
  local_e0 = flags;
  do {
    pcVar2 = SkipSpaces(s_local);
    cVar6 = *pcVar2;
    if (cVar6 == '\0') {
      return;
    }
    lVar5 = 0;
    s_local = pcVar2;
    while (cVar6 != '\0') {
      iVar1 = isspace((int)cVar6);
      if ((cVar6 == '=') || (iVar1 != 0)) break;
      s_local = pcVar2 + lVar5 + 1;
      lVar3 = lVar5 + 1;
      lVar5 = lVar5 + 1;
      cVar6 = pcVar2[lVar3];
    }
    name.super_Buffer<char>.ptr_ = name.data_;
    name.super_Buffer<char>.size_ = 0;
    name.super_Buffer<char>.capacity_ = 0x32;
    name.super_Buffer<char>._vptr_Buffer = local_d0;
    fmt::Buffer<char>::resize(&name.super_Buffer<char>,lVar5 + 1);
    for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
      name.super_Buffer<char>.ptr_[lVar3] = pcVar2[lVar3];
    }
    name.super_Buffer<char>.ptr_[lVar5] = '\0';
    s_local = SkipSpaces(s_local);
    cVar6 = *s_local;
    if (cVar6 == '=') {
      s_local = SkipSpaces(s_local + 1);
    }
    pSVar4 = SolverOptionManager::FindOption(local_d8,name.super_Buffer<char>.ptr_,true);
    pcVar2 = s_local;
    if (pSVar4 == (SolverOption *)0x0) {
      (*(this->super_ErrorHandler)._vptr_ErrorHandler[6])(this,name.super_Buffer<char>.ptr_);
    }
    else if (*s_local == '?') {
      if (s_local[1] != '\0') {
        iVar1 = isspace((int)s_local[1]);
        if (iVar1 == 0) goto LAB_001ce21f;
      }
      s_local = pcVar2 + 1;
      if ((local_e0 & 1) == 0) {
        (*pSVar4->_vptr_SolverOption[0xb])(&local_70,pSVar4);
        Print<std::__cxx11::string>(this,(CStringRef)0x1efcec,&local_70);
        this_00 = &local_70;
LAB_001ce2c5:
        std::__cxx11::string::~string((string *)this_00);
      }
    }
    else {
LAB_001ce21f:
      if (cVar6 == '=') {
        iVar1 = (*pSVar4->_vptr_SolverOption[2])(pSVar4);
        if ((char)iVar1 != '\0') {
          local_70._M_dataplus._M_p = name.super_Buffer<char>.ptr_;
          ReportError<char*>(this,(CStringRef)0x1efc8b,(char **)&local_70);
          s_local = SkipNonSpaces(s_local);
          goto LAB_001ce2ca;
        }
      }
      else {
        (*pSVar4->_vptr_SolverOption[2])(pSVar4);
      }
      (*pSVar4->_vptr_SolverOption[0xd])(pSVar4,&s_local,(ulong)local_dc);
      if ((local_e0 & 1) == 0) {
        (*pSVar4->_vptr_SolverOption[0xb])(&local_50,pSVar4);
        std::operator+(&local_70,&local_50,'\n');
        Print<std::__cxx11::string>(this,(CStringRef)0x1efc08,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        this_00 = &local_50;
        goto LAB_001ce2c5;
      }
    }
LAB_001ce2ca:
    fmt::internal::MemoryBuffer<char,_50UL,_std::allocator<char>_>::~MemoryBuffer(&name);
  } while( true );
}

Assistant:

void BasicSolver::ParseOptionString(
    const char *s, unsigned flags) {
  for (;;) {
    if (!*(s = SkipSpaces(s)))
      return;

    // Parse the option name.
    const char *name_start = s;
    while (*s && !std::isspace(*s) && *s != '=')
      ++s;
    fmt::internal::MemoryBuffer<char, 50> name;
    std::size_t name_size = s - name_start;
    name.resize(name_size + 1);
    for (std::size_t i = 0; i < name_size; ++i)
      name[i] = name_start[i];
    name[name_size] = 0;

    // Check if we have an '=' sign,
    // skip all spaces intil next token.
    bool equal_sign = false;
    s = SkipSpaces(s);
    if (*s == '=') {
      s = SkipSpaces(s + 1);
      equal_sign = true;
    }

    // Parse option name.
    SolverOption *opt = FindOption(&name[0], true);
    if (!opt) {
      HandleUnknownOption(&name[0]);
      continue;       // in case it does not throw
    }

    // If user asks the default/current value.
    if (*s == '?') {
      char next = s[1];
      if (!next || std::isspace(next)) {
        ++s;
        if ((flags & NO_OPTION_ECHO) == 0) {
          Print("  {}\n", opt->echo_with_value());
        }
        continue;
      }
    }

    /// Parse value if needed.
    if (equal_sign) {
      // No '=' for flags.
      if (opt->is_flag()) {
        ReportError(
              "Option \"{}\" doesn't accept an argument",
              &name[0]);
        s = SkipNonSpaces(s);    // In case we go on
        continue;
      } else {
        opt->Parse(s, flags & FROM_COMMAND_LINE);
      }
    } else {
      if (opt->is_flag()) {         // Might set some flag
        opt->Parse(s, flags & FROM_COMMAND_LINE);
      } else {                      // Even w/o '=' sign
        opt->Parse(s, flags & FROM_COMMAND_LINE);
      }
    }

    // Echo name [= value].
    if ((flags & NO_OPTION_ECHO) == 0) {
      Print("  {}", opt->echo_with_value() + '\n');
    }
  }
}